

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_structure_test.cc
# Opt level: O0

void __thiscall
xLearn::DMATRIX_TEST_ReAlloc_Test::~DMATRIX_TEST_ReAlloc_Test(DMATRIX_TEST_ReAlloc_Test *this)

{
  void *in_RDI;
  
  ~DMATRIX_TEST_ReAlloc_Test((DMATRIX_TEST_ReAlloc_Test *)0x15c798);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(DMATRIX_TEST, ReAlloc) {
  DMatrix matrix;
  matrix.ReAlloc(kLength, false);
  EXPECT_EQ(matrix.hash_value_1, 0);
  EXPECT_EQ(matrix.hash_value_2, 0);
  EXPECT_EQ(matrix.row_length, kLength);
  EXPECT_EQ(matrix.row.size(), kLength);
  EXPECT_EQ(matrix.Y.size(), kLength);
  EXPECT_EQ(matrix.norm.size(), kLength);
  EXPECT_EQ(matrix.has_label, false);
  EXPECT_EQ(matrix.pos, 0);
}